

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * testing::internal::FlagToEnvVar_abi_cxx11_(char *flag)

{
  char cVar1;
  Message *this;
  Message *pMVar2;
  string *in_RDI;
  size_t i;
  Message env_var;
  string full_flag;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Message *in_stack_ffffffffffffff70;
  Message *this_00;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  Message *local_58;
  string local_30 [48];
  
  Message::Message((Message *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  Message::operator<<(in_stack_ffffffffffffff70,
                      (char (*) [7])CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  this = Message::operator<<(in_stack_ffffffffffffff70,
                             (char **)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68))
  ;
  Message::GetString_abi_cxx11_(this);
  Message::~Message((Message *)0x191acf);
  Message::Message((Message *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  local_58 = (Message *)0x0;
  while( true ) {
    this_00 = local_58;
    pMVar2 = (Message *)std::__cxx11::string::length();
    if (this_00 == pMVar2) break;
    std::__cxx11::string::c_str();
    cVar1 = ToUpper('\0');
    Message::operator<<(this_00,(char *)CONCAT17(cVar1,in_stack_ffffffffffffff68));
    local_58 = (Message *)((long)&(local_58->ss_).ptr_ + 1);
  }
  Message::GetString_abi_cxx11_(this);
  Message::~Message((Message *)0x191bb1);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}